

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_StringFromOrdinalNumberTens_Test::
~TEST_SimpleString_StringFromOrdinalNumberTens_Test
          (TEST_SimpleString_StringFromOrdinalNumberTens_Test *this)

{
  TEST_SimpleString_StringFromOrdinalNumberTens_Test *this_local;
  
  ~TEST_SimpleString_StringFromOrdinalNumberTens_Test(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleString, StringFromOrdinalNumberTens)
{
    STRCMP_EQUAL("10th", StringFromOrdinalNumber(10).asCharString());
    STRCMP_EQUAL("11th", StringFromOrdinalNumber(11).asCharString());
    STRCMP_EQUAL("12th", StringFromOrdinalNumber(12).asCharString());
    STRCMP_EQUAL("13th", StringFromOrdinalNumber(13).asCharString());
    STRCMP_EQUAL("14th", StringFromOrdinalNumber(14).asCharString());
    STRCMP_EQUAL("18th", StringFromOrdinalNumber(18).asCharString());
}